

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_A_ParamSet.c
# Opt level: O3

void fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_to_bytes(uint8_t *out1,uint64_t *arg1)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar6 = (arg1[1] - (ulong)(-(uint)(*arg1 + 0xfff0000000000269 >> 0x34) & 0xff)) +
          0xfff8000000000001;
  uVar7 = (arg1[2] - (ulong)(-(uint)(uVar6 >> 0x33) & 0xff)) + 0xfff8000000000001;
  uVar9 = (arg1[3] - (ulong)(-(uint)(uVar7 >> 0x33) & 0xff)) + 0xfff8000000000001;
  uVar8 = (arg1[4] - (ulong)(-(uint)(uVar9 >> 0x33) & 0xff)) + 0xfff8000000000001;
  uVar4 = -(ulong)((uVar8 & 0x7f8000000000000) != 0);
  uVar2 = (uVar4 & 0xffffffffffd97) + (*arg1 + 0xfff0000000000269 & 0xfffffffffffff);
  uVar1 = uVar4 & 0x7ffffffffffff;
  uVar6 = (uVar6 & 0x7ffffffffffff) + uVar1 + (uVar2 >> 0x34);
  uVar7 = (uVar7 & 0x7ffffffffffff) + uVar1 + (uVar6 >> 0x33);
  uVar1 = uVar1 + (uVar9 & 0x7ffffffffffff) + (uVar7 >> 0x33);
  uVar4 = uVar4 + uVar8 + (uVar1 >> 0x33);
  uVar5 = (uint)uVar7;
  uVar3 = (uint)uVar6;
  *out1 = (uint8_t)uVar2;
  out1[1] = (uint8_t)(uVar2 >> 8);
  out1[2] = (uint8_t)(uVar2 >> 0x10);
  out1[3] = (uint8_t)(uVar2 >> 0x18);
  out1[4] = (uint8_t)(uVar2 >> 0x20);
  out1[5] = (uint8_t)(uVar2 >> 0x28);
  out1[6] = (byte)(uVar2 >> 0x30) & 0xf | (byte)(uVar3 << 4);
  out1[7] = (uint8_t)(uVar3 >> 4);
  out1[8] = (uint8_t)(uVar3 >> 0xc);
  out1[9] = (uint8_t)(uVar3 >> 0x14);
  out1[10] = (uint8_t)(uVar6 >> 0x1c);
  out1[0xb] = (uint8_t)(uVar6 >> 0x24);
  out1[0xc] = (byte)(uint)(uVar6 >> 0x2c) & 0x7f | (byte)(uVar5 << 7);
  out1[0xd] = (uint8_t)(uVar5 >> 1);
  out1[0xe] = (uint8_t)(uVar5 >> 9);
  out1[0xf] = (uint8_t)(uVar5 >> 0x11);
  out1[0x10] = (uint8_t)(uVar7 >> 0x19);
  out1[0x11] = (uint8_t)(uVar7 >> 0x21);
  out1[0x12] = (uint8_t)(uVar7 >> 0x29);
  out1[0x13] = ((byte)(uint)(uVar7 >> 0x31) & 3) + (char)uVar1 * '\x04';
  out1[0x14] = (uint8_t)(uVar1 >> 6);
  out1[0x15] = (uint8_t)(uVar1 >> 0xe);
  out1[0x16] = (uint8_t)(uVar1 >> 0x16);
  out1[0x17] = (uint8_t)(uVar1 >> 0x1e);
  out1[0x18] = (uint8_t)(uVar1 >> 0x26);
  out1[0x19] = (byte)(uint)(uVar1 >> 0x2e) & 0x1f | (byte)((int)uVar4 << 5);
  out1[0x1a] = (uint8_t)(uVar4 >> 3);
  out1[0x1b] = (uint8_t)(uVar4 >> 0xb);
  out1[0x1c] = (uint8_t)(uVar4 >> 0x13);
  out1[0x1d] = (uint8_t)(uVar4 >> 0x1b);
  out1[0x1e] = (uint8_t)(uVar4 >> 0x23);
  out1[0x1f] = (uint8_t)(uVar4 >> 0x2b);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_to_bytes(
    uint8_t out1[32], const uint64_t arg1[5]) {
    uint64_t x1;
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1 x2;
    uint64_t x3;
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1 x4;
    uint64_t x5;
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1 x6;
    uint64_t x7;
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1 x8;
    uint64_t x9;
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1 x10;
    uint64_t x11;
    uint64_t x12;
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1 x13;
    uint64_t x14;
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1 x15;
    uint64_t x16;
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1 x17;
    uint64_t x18;
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1 x19;
    uint64_t x20;
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1 x21;
    uint64_t x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    uint8_t x26;
    uint64_t x27;
    uint8_t x28;
    uint64_t x29;
    uint8_t x30;
    uint64_t x31;
    uint8_t x32;
    uint64_t x33;
    uint8_t x34;
    uint64_t x35;
    uint8_t x36;
    uint8_t x37;
    uint64_t x38;
    uint8_t x39;
    uint64_t x40;
    uint8_t x41;
    uint64_t x42;
    uint8_t x43;
    uint64_t x44;
    uint8_t x45;
    uint64_t x46;
    uint8_t x47;
    uint64_t x48;
    uint8_t x49;
    uint8_t x50;
    uint64_t x51;
    uint8_t x52;
    uint64_t x53;
    uint8_t x54;
    uint64_t x55;
    uint8_t x56;
    uint64_t x57;
    uint8_t x58;
    uint64_t x59;
    uint8_t x60;
    uint64_t x61;
    uint8_t x62;
    uint64_t x63;
    uint8_t x64;
    uint8_t x65;
    uint64_t x66;
    uint8_t x67;
    uint64_t x68;
    uint8_t x69;
    uint64_t x70;
    uint8_t x71;
    uint64_t x72;
    uint8_t x73;
    uint64_t x74;
    uint8_t x75;
    uint64_t x76;
    uint8_t x77;
    uint8_t x78;
    uint64_t x79;
    uint8_t x80;
    uint64_t x81;
    uint8_t x82;
    uint64_t x83;
    uint8_t x84;
    uint64_t x85;
    uint8_t x86;
    uint64_t x87;
    uint8_t x88;
    uint64_t x89;
    uint8_t x90;
    uint8_t x91;
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_subborrowx_u52(
        &x1, &x2, 0x0, (arg1[0]), UINT64_C(0xffffffffffd97));
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_subborrowx_u51(
        &x3, &x4, x2, (arg1[1]), UINT64_C(0x7ffffffffffff));
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_subborrowx_u51(
        &x5, &x6, x4, (arg1[2]), UINT64_C(0x7ffffffffffff));
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_subborrowx_u51(
        &x7, &x8, x6, (arg1[3]), UINT64_C(0x7ffffffffffff));
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_subborrowx_u51(
        &x9, &x10, x8, (arg1[4]), UINT64_C(0x7ffffffffffff));
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_cmovznz_u64(
        &x11, x10, 0x0, UINT64_C(0xffffffffffffffff));
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_addcarryx_u52(
        &x12, &x13, 0x0, x1, (x11 & UINT64_C(0xffffffffffd97)));
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_addcarryx_u51(
        &x14, &x15, x13, x3, (x11 & UINT64_C(0x7ffffffffffff)));
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_addcarryx_u51(
        &x16, &x17, x15, x5, (x11 & UINT64_C(0x7ffffffffffff)));
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_addcarryx_u51(
        &x18, &x19, x17, x7, (x11 & UINT64_C(0x7ffffffffffff)));
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_addcarryx_u51(
        &x20, &x21, x19, x9, (x11 & UINT64_C(0x7ffffffffffff)));
    x22 = (x20 << 5);
    x23 = (x18 << 2);
    x24 = (x16 << 7);
    x25 = (x14 << 4);
    x26 = (uint8_t)(x12 & UINT8_C(0xff));
    x27 = (x12 >> 8);
    x28 = (uint8_t)(x27 & UINT8_C(0xff));
    x29 = (x27 >> 8);
    x30 = (uint8_t)(x29 & UINT8_C(0xff));
    x31 = (x29 >> 8);
    x32 = (uint8_t)(x31 & UINT8_C(0xff));
    x33 = (x31 >> 8);
    x34 = (uint8_t)(x33 & UINT8_C(0xff));
    x35 = (x33 >> 8);
    x36 = (uint8_t)(x35 & UINT8_C(0xff));
    x37 = (uint8_t)(x35 >> 8);
    x38 = (x25 + (uint64_t)x37);
    x39 = (uint8_t)(x38 & UINT8_C(0xff));
    x40 = (x38 >> 8);
    x41 = (uint8_t)(x40 & UINT8_C(0xff));
    x42 = (x40 >> 8);
    x43 = (uint8_t)(x42 & UINT8_C(0xff));
    x44 = (x42 >> 8);
    x45 = (uint8_t)(x44 & UINT8_C(0xff));
    x46 = (x44 >> 8);
    x47 = (uint8_t)(x46 & UINT8_C(0xff));
    x48 = (x46 >> 8);
    x49 = (uint8_t)(x48 & UINT8_C(0xff));
    x50 = (uint8_t)(x48 >> 8);
    x51 = (x24 + (uint64_t)x50);
    x52 = (uint8_t)(x51 & UINT8_C(0xff));
    x53 = (x51 >> 8);
    x54 = (uint8_t)(x53 & UINT8_C(0xff));
    x55 = (x53 >> 8);
    x56 = (uint8_t)(x55 & UINT8_C(0xff));
    x57 = (x55 >> 8);
    x58 = (uint8_t)(x57 & UINT8_C(0xff));
    x59 = (x57 >> 8);
    x60 = (uint8_t)(x59 & UINT8_C(0xff));
    x61 = (x59 >> 8);
    x62 = (uint8_t)(x61 & UINT8_C(0xff));
    x63 = (x61 >> 8);
    x64 = (uint8_t)(x63 & UINT8_C(0xff));
    x65 = (uint8_t)(x63 >> 8);
    x66 = (x23 + (uint64_t)x65);
    x67 = (uint8_t)(x66 & UINT8_C(0xff));
    x68 = (x66 >> 8);
    x69 = (uint8_t)(x68 & UINT8_C(0xff));
    x70 = (x68 >> 8);
    x71 = (uint8_t)(x70 & UINT8_C(0xff));
    x72 = (x70 >> 8);
    x73 = (uint8_t)(x72 & UINT8_C(0xff));
    x74 = (x72 >> 8);
    x75 = (uint8_t)(x74 & UINT8_C(0xff));
    x76 = (x74 >> 8);
    x77 = (uint8_t)(x76 & UINT8_C(0xff));
    x78 = (uint8_t)(x76 >> 8);
    x79 = (x22 + (uint64_t)x78);
    x80 = (uint8_t)(x79 & UINT8_C(0xff));
    x81 = (x79 >> 8);
    x82 = (uint8_t)(x81 & UINT8_C(0xff));
    x83 = (x81 >> 8);
    x84 = (uint8_t)(x83 & UINT8_C(0xff));
    x85 = (x83 >> 8);
    x86 = (uint8_t)(x85 & UINT8_C(0xff));
    x87 = (x85 >> 8);
    x88 = (uint8_t)(x87 & UINT8_C(0xff));
    x89 = (x87 >> 8);
    x90 = (uint8_t)(x89 & UINT8_C(0xff));
    x91 = (uint8_t)(x89 >> 8);
    out1[0] = x26;
    out1[1] = x28;
    out1[2] = x30;
    out1[3] = x32;
    out1[4] = x34;
    out1[5] = x36;
    out1[6] = x39;
    out1[7] = x41;
    out1[8] = x43;
    out1[9] = x45;
    out1[10] = x47;
    out1[11] = x49;
    out1[12] = x52;
    out1[13] = x54;
    out1[14] = x56;
    out1[15] = x58;
    out1[16] = x60;
    out1[17] = x62;
    out1[18] = x64;
    out1[19] = x67;
    out1[20] = x69;
    out1[21] = x71;
    out1[22] = x73;
    out1[23] = x75;
    out1[24] = x77;
    out1[25] = x80;
    out1[26] = x82;
    out1[27] = x84;
    out1[28] = x86;
    out1[29] = x88;
    out1[30] = x90;
    out1[31] = x91;
}